

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite.c
# Opt level: O1

int jx9HashmapValuesToSet(jx9_hashmap *pMap,SySet *pOut)

{
  jx9_vm *pjVar1;
  jx9_hashmap_node *pjVar2;
  uint uVar3;
  jx9_value *pValue;
  long local_30;
  
  pjVar2 = pMap->pFirst;
  pjVar1 = pMap->pVm;
  pOut->nSize = 0;
  pOut->eSize = 8;
  uVar3 = 0;
  pOut->nUsed = 0;
  pOut->nCursor = 0;
  pOut->pAllocator = &pjVar1->sAllocator;
  pOut->pBase = (void *)0x0;
  pOut->pUserData = (void *)0x0;
  if (pMap->nEntry != 0) {
    do {
      pjVar1 = pjVar2->pMap->pVm;
      if (pjVar2->nValIdx < (pjVar1->aMemObj).nUsed) {
        local_30 = (ulong)(pjVar2->nValIdx * (pjVar1->aMemObj).eSize) +
                   (long)(pjVar1->aMemObj).pBase;
      }
      else {
        local_30 = 0;
      }
      if (local_30 != 0) {
        SySetPut(pOut,&local_30);
      }
      pjVar2 = pjVar2->pPrev;
      uVar3 = uVar3 + 1;
    } while (uVar3 < pMap->nEntry);
  }
  return pOut->nUsed;
}

Assistant:

JX9_PRIVATE int jx9HashmapValuesToSet(jx9_hashmap *pMap, SySet *pOut)
{
	jx9_hashmap_node *pEntry = pMap->pFirst;
	jx9_value *pValue;
	sxu32 n;
	/* Initialize the container */
	SySetInit(pOut, &pMap->pVm->sAllocator, sizeof(jx9_value *));
	for(n = 0 ; n < pMap->nEntry ; n++ ){
		/* Extract node value */
		pValue = HashmapExtractNodeValue(pEntry);
		if( pValue ){
			SySetPut(pOut, (const void *)&pValue);
		}
		/* Point to the next entry */
		pEntry = pEntry->pPrev; /* Reverse link */
	}
	/* Total inserted entries */
	return (int)SySetUsed(pOut);
}